

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O0

bool __thiscall gnilk::IPCFifoUnix::ConnectTo(IPCFifoUnix *this,string *name)

{
  int iVar1;
  char *__file;
  string *name_local;
  IPCFifoUnix *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->fifoname,name);
  __file = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&this->fifoname);
  iVar1 = open(__file,2);
  this->rwfd = iVar1;
  if (this->rwfd < 0) {
    if ((this->isOwner & 1U) != 0) {
      close(this->fifofd);
    }
    perror("IPCFifoUnix::Open, open");
    this_local._7_1_ = false;
  }
  else {
    this->isOpen = true;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IPCFifoUnix::ConnectTo(const std::string name) {
    fifoname = name;

    // Open it in Read/Write mode - note: this might not be supported everywhere
    rwfd = open(fifoname.c_str(), O_RDWR);
    if (rwfd < 0) {
        if (isOwner) {
            close(fifofd);
        }
        perror("IPCFifoUnix::Open, open");
        return false;
    }

    // All good - tag and bag em...
    isOpen = true;
    return true;


}